

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

double __thiscall
duckdb::Interpolator<true>::Extract<double,double>
          (Interpolator<true> *this,double *dest,Vector *result)

{
  double input;
  bool bVar1;
  InvalidInputException *this_00;
  duckdb *this_01;
  double result_1;
  double local_40;
  string local_38;
  
  input = *dest;
  this_01 = (duckdb *)0x0;
  bVar1 = TryCast::Operation<double,double>(input,&local_40,false);
  if (bVar1) {
    return local_40;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  CastExceptionText<double,double>(&local_38,this_01,input);
  InvalidInputException::InvalidInputException(this_00,&local_38);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TARGET_TYPE Cast(const INPUT_TYPE &src, Vector &result) {
		return Cast::Operation<INPUT_TYPE, TARGET_TYPE>(src);
	}